

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcher.cpp
# Opt level: O2

void FileWatcherRemoveAllWatches(HFileWatcher handle)

{
  std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)handle + 0x38))->__data);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)handle + 0x10));
  pthread_mutex_unlock((pthread_mutex_t *)((long)handle + 0x38));
  return;
}

Assistant:

void FileWatcherRemoveAllWatches(HFileWatcher handle) {
    FileWatcher* watcher = (FileWatcher*)handle;
    std::lock_guard<std::mutex> guard(watcher->Mutex);
    watcher->Watches.clear();
}